

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdmauth.c
# Opt level: O1

ssh_cipher * des_xdmauth_cipher(void *vkeydata)

{
  long lVar1;
  ssh_cipher *psVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uchar key [8];
  char local_18 [8];
  
  lVar1 = 0;
  uVar4 = 0;
  iVar5 = 0;
  iVar3 = 0;
  do {
    if (iVar3 < 7) {
      uVar4 = uVar4 << 8 | (uint)*(byte *)((long)vkeydata + (long)iVar5);
      iVar3 = iVar3 + 8;
      iVar5 = iVar5 + 1;
    }
    iVar3 = iVar3 + -7;
    local_18[lVar1] = (char)(uVar4 >> ((byte)iVar3 & 0x1f)) * '\x02';
    uVar4 = uVar4 & ~(0x7f << ((byte)iVar3 & 0x1f));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  psVar2 = des_cbc_new(&ssh_des);
  (*psVar2->vt->setkey)(psVar2,local_18);
  smemclr(local_18,8);
  (*psVar2->vt->setiv)(psVar2,local_18);
  return psVar2;
}

Assistant:

static ssh_cipher *des_xdmauth_cipher(const void *vkeydata)
{
    /*
     * XDM-AUTHORIZATION-1 uses single-DES, but packs the key into 7
     * bytes, so here we have to repack it manually into the canonical
     * form where it occupies 8 bytes each with the low bit unused.
     */
    const unsigned char *keydata = (const unsigned char *)vkeydata;
    unsigned char key[8];
    int i, nbits, j;
    unsigned int bits;

    bits = 0;
    nbits = 0;
    j = 0;
    for (i = 0; i < 8; i++) {
        if (nbits < 7) {
            bits = (bits << 8) | keydata[j];
            nbits += 8;
            j++;
        }
        key[i] = (bits >> (nbits - 7)) << 1;
        bits &= ~(0x7F << (nbits - 7));
        nbits -= 7;
    }

    ssh_cipher *c = ssh_cipher_new(&ssh_des);
    ssh_cipher_setkey(c, key);
    smemclr(key, sizeof(key));
    ssh_cipher_setiv(c, key);
    return c;
}